

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topology.cpp
# Opt level: O2

GrobIndex __thiscall lume::TotalToGrobIndexMap::operator()(TotalToGrobIndexMap *this,index_t ind)

{
  uint *puVar1;
  pointer puVar2;
  pointer pgVar3;
  GrobIndex GVar4;
  LumeError *this_00;
  string *what;
  long lVar5;
  allocator local_59;
  string local_58;
  string local_38 [32];
  
  puVar2 = (this->m_baseInds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pgVar3 = (this->m_grobTypes).super__Vector_base<lume::grob_t,_std::allocator<lume::grob_t>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = 0;
  while( true ) {
    if ((long)(this->m_grobTypes).super__Vector_base<lume::grob_t,_std::allocator<lume::grob_t>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)pgVar3 >> 2 == lVar5) {
      this_00 = (LumeError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_38,"TotalToGrobIndexMap: Couldn\'t map index ",&local_59);
      std::__cxx11::to_string(&local_58,ind);
      what = (string *)std::__cxx11::string::append(local_38);
      LumeError::LumeError(this_00,what);
      __cxa_throw(this_00,&LumeError::typeinfo,LumeError::~LumeError);
    }
    puVar1 = puVar2 + lVar5;
    if ((*puVar1 <= ind) && (ind < puVar2[lVar5 + 1])) break;
    lVar5 = lVar5 + 1;
  }
  GVar4.index = ind - *puVar1;
  GVar4.grobType = pgVar3[lVar5];
  return GVar4;
}

Assistant:

GrobIndex TotalToGrobIndexMap::
operator () (const index_t ind) const
{
	const size_t numGrobTypes = m_grobTypes.size();
    for(size_t i = 0; i < numGrobTypes; ++i) {
      	if (ind >= m_baseInds [i] && ind < m_baseInds [i+1])
        	return GrobIndex(m_grobTypes[i], ind - m_baseInds[i]);
    }

    throw LumeError (string("TotalToGrobIndexMap: Couldn't map index ").
    					append (to_string(ind)));
    return GrobIndex (NO_GROB, 0);
}